

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qtablewidget.cpp
# Opt level: O2

void QTableWidget::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  int *piVar1;
  bool bVar2;
  int iVar3;
  ScrollHint hint;
  QTableWidgetItem *item;
  
  switch(_c) {
  case InvokeMetaMethod:
    switch(_id) {
    case 0:
      itemPressed((QTableWidget *)_o,*_a[1]);
      return;
    case 1:
      itemClicked((QTableWidget *)_o,*_a[1]);
      return;
    case 2:
      itemDoubleClicked((QTableWidget *)_o,*_a[1]);
      return;
    case 3:
      itemActivated((QTableWidget *)_o,*_a[1]);
      return;
    case 4:
      itemEntered((QTableWidget *)_o,*_a[1]);
      return;
    case 5:
      itemChanged((QTableWidget *)_o,*_a[1]);
      return;
    case 6:
      currentItemChanged((QTableWidget *)_o,*_a[1],*_a[2]);
      return;
    case 7:
      itemSelectionChanged((QTableWidget *)_o);
      return;
    case 8:
      cellPressed((QTableWidget *)_o,*_a[1],*_a[2]);
      return;
    case 9:
      cellClicked((QTableWidget *)_o,*_a[1],*_a[2]);
      return;
    case 10:
      cellDoubleClicked((QTableWidget *)_o,*_a[1],*_a[2]);
      return;
    case 0xb:
      cellActivated((QTableWidget *)_o,*_a[1],*_a[2]);
      return;
    case 0xc:
      cellEntered((QTableWidget *)_o,*_a[1],*_a[2]);
      return;
    case 0xd:
      cellChanged((QTableWidget *)_o,*_a[1],*_a[2]);
      return;
    case 0xe:
      currentCellChanged((QTableWidget *)_o,*_a[1],*_a[2],*_a[3],*_a[4]);
      return;
    case 0xf:
      item = *_a[1];
      hint = *_a[2];
      break;
    case 0x10:
      item = *_a[1];
      hint = EnsureVisible;
      break;
    case 0x11:
      insertRow((QTableWidget *)_o,*_a[1]);
      return;
    case 0x12:
      insertColumn((QTableWidget *)_o,*_a[1]);
      return;
    case 0x13:
      removeRow((QTableWidget *)_o,*_a[1]);
      return;
    case 0x14:
      removeColumn((QTableWidget *)_o,*_a[1]);
      return;
    case 0x15:
      clear((QTableWidget *)_o);
      return;
    case 0x16:
      clearContents((QTableWidget *)_o);
      return;
    default:
      goto switchD_00539a27_caseD_3;
    }
    scrollToItem((QTableWidget *)_o,item,hint);
    return;
  case ReadProperty:
    piVar1 = (int *)*_a;
    if (_id == 1) {
      iVar3 = columnCount((QTableWidget *)_o);
    }
    else {
      if (_id != 0) {
        return;
      }
      iVar3 = rowCount((QTableWidget *)_o);
    }
    *piVar1 = iVar3;
    break;
  case WriteProperty:
    if (_id == 1) {
      setColumnCount((QTableWidget *)_o,**_a);
      return;
    }
    if (_id == 0) {
      setRowCount((QTableWidget *)_o,**_a);
      return;
    }
    break;
  case IndexOfMethod:
    bVar2 = QtMocHelpers::indexOfMethod<void(QTableWidget::*)(QTableWidgetItem*)>
                      ((QtMocHelpers *)_a,(void **)itemPressed,0,0);
    if (((((!bVar2) &&
          (bVar2 = QtMocHelpers::indexOfMethod<void(QTableWidget::*)(QTableWidgetItem*)>
                             ((QtMocHelpers *)_a,(void **)itemClicked,0,1), !bVar2)) &&
         (bVar2 = QtMocHelpers::indexOfMethod<void(QTableWidget::*)(QTableWidgetItem*)>
                            ((QtMocHelpers *)_a,(void **)itemDoubleClicked,0,2), !bVar2)) &&
        ((((bVar2 = QtMocHelpers::indexOfMethod<void(QTableWidget::*)(QTableWidgetItem*)>
                              ((QtMocHelpers *)_a,(void **)itemActivated,0,3), !bVar2 &&
           (bVar2 = QtMocHelpers::indexOfMethod<void(QTableWidget::*)(QTableWidgetItem*)>
                              ((QtMocHelpers *)_a,(void **)itemEntered,0,4), !bVar2)) &&
          ((bVar2 = QtMocHelpers::indexOfMethod<void(QTableWidget::*)(QTableWidgetItem*)>
                              ((QtMocHelpers *)_a,(void **)itemChanged,0,5), !bVar2 &&
           ((bVar2 = QtMocHelpers::
                     indexOfMethod<void(QTableWidget::*)(QTableWidgetItem*,QTableWidgetItem*)>
                               ((QtMocHelpers *)_a,(void **)currentItemChanged,0,6), !bVar2 &&
            (bVar2 = QtMocHelpers::indexOfMethod<void(QTableWidget::*)()>
                               ((QtMocHelpers *)_a,(void **)itemSelectionChanged,0,7), !bVar2))))))
         && (bVar2 = QtMocHelpers::indexOfMethod<void(QTableWidget::*)(int,int)>
                               ((QtMocHelpers *)_a,(void **)cellPressed,0,8), !bVar2)))) &&
       ((((bVar2 = QtMocHelpers::indexOfMethod<void(QTableWidget::*)(int,int)>
                             ((QtMocHelpers *)_a,(void **)cellClicked,0,9), !bVar2 &&
          (bVar2 = QtMocHelpers::indexOfMethod<void(QTableWidget::*)(int,int)>
                             ((QtMocHelpers *)_a,(void **)cellDoubleClicked,0,10), !bVar2)) &&
         (bVar2 = QtMocHelpers::indexOfMethod<void(QTableWidget::*)(int,int)>
                            ((QtMocHelpers *)_a,(void **)cellActivated,0,0xb), !bVar2)) &&
        ((bVar2 = QtMocHelpers::indexOfMethod<void(QTableWidget::*)(int,int)>
                            ((QtMocHelpers *)_a,(void **)cellEntered,0,0xc), !bVar2 &&
         (bVar2 = QtMocHelpers::indexOfMethod<void(QTableWidget::*)(int,int)>
                            ((QtMocHelpers *)_a,(void **)cellChanged,0,0xd), !bVar2)))))) {
      QtMocHelpers::indexOfMethod<void(QTableWidget::*)(int,int,int,int)>
                ((QtMocHelpers *)_a,(void **)currentCellChanged,0,0xe);
      return;
    }
  }
switchD_00539a27_caseD_3:
  return;
}

Assistant:

void QTableWidget::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QTableWidget *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->itemPressed((*reinterpret_cast< std::add_pointer_t<QTableWidgetItem*>>(_a[1]))); break;
        case 1: _t->itemClicked((*reinterpret_cast< std::add_pointer_t<QTableWidgetItem*>>(_a[1]))); break;
        case 2: _t->itemDoubleClicked((*reinterpret_cast< std::add_pointer_t<QTableWidgetItem*>>(_a[1]))); break;
        case 3: _t->itemActivated((*reinterpret_cast< std::add_pointer_t<QTableWidgetItem*>>(_a[1]))); break;
        case 4: _t->itemEntered((*reinterpret_cast< std::add_pointer_t<QTableWidgetItem*>>(_a[1]))); break;
        case 5: _t->itemChanged((*reinterpret_cast< std::add_pointer_t<QTableWidgetItem*>>(_a[1]))); break;
        case 6: _t->currentItemChanged((*reinterpret_cast< std::add_pointer_t<QTableWidgetItem*>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QTableWidgetItem*>>(_a[2]))); break;
        case 7: _t->itemSelectionChanged(); break;
        case 8: _t->cellPressed((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2]))); break;
        case 9: _t->cellClicked((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2]))); break;
        case 10: _t->cellDoubleClicked((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2]))); break;
        case 11: _t->cellActivated((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2]))); break;
        case 12: _t->cellEntered((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2]))); break;
        case 13: _t->cellChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2]))); break;
        case 14: _t->currentCellChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[3])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[4]))); break;
        case 15: _t->scrollToItem((*reinterpret_cast< std::add_pointer_t<const QTableWidgetItem*>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QAbstractItemView::ScrollHint>>(_a[2]))); break;
        case 16: _t->scrollToItem((*reinterpret_cast< std::add_pointer_t<const QTableWidgetItem*>>(_a[1]))); break;
        case 17: _t->insertRow((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 18: _t->insertColumn((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 19: _t->removeRow((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 20: _t->removeColumn((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 21: _t->clear(); break;
        case 22: _t->clearContents(); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QTableWidget::*)(QTableWidgetItem * )>(_a, &QTableWidget::itemPressed, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTableWidget::*)(QTableWidgetItem * )>(_a, &QTableWidget::itemClicked, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTableWidget::*)(QTableWidgetItem * )>(_a, &QTableWidget::itemDoubleClicked, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTableWidget::*)(QTableWidgetItem * )>(_a, &QTableWidget::itemActivated, 3))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTableWidget::*)(QTableWidgetItem * )>(_a, &QTableWidget::itemEntered, 4))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTableWidget::*)(QTableWidgetItem * )>(_a, &QTableWidget::itemChanged, 5))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTableWidget::*)(QTableWidgetItem * , QTableWidgetItem * )>(_a, &QTableWidget::currentItemChanged, 6))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTableWidget::*)()>(_a, &QTableWidget::itemSelectionChanged, 7))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTableWidget::*)(int , int )>(_a, &QTableWidget::cellPressed, 8))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTableWidget::*)(int , int )>(_a, &QTableWidget::cellClicked, 9))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTableWidget::*)(int , int )>(_a, &QTableWidget::cellDoubleClicked, 10))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTableWidget::*)(int , int )>(_a, &QTableWidget::cellActivated, 11))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTableWidget::*)(int , int )>(_a, &QTableWidget::cellEntered, 12))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTableWidget::*)(int , int )>(_a, &QTableWidget::cellChanged, 13))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTableWidget::*)(int , int , int , int )>(_a, &QTableWidget::currentCellChanged, 14))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<int*>(_v) = _t->rowCount(); break;
        case 1: *reinterpret_cast<int*>(_v) = _t->columnCount(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setRowCount(*reinterpret_cast<int*>(_v)); break;
        case 1: _t->setColumnCount(*reinterpret_cast<int*>(_v)); break;
        default: break;
        }
    }
}